

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buddy_allocator.h
# Opt level: O2

void __thiscall cppcms::impl::buddy_allocator::free(buddy_allocator *this,void *__ptr)

{
  if (__ptr != (void *)0x0) {
    free_page(this,(page *)((long)__ptr + -0x10));
    return;
  }
  return;
}

Assistant:

void free(void *ptr)
	{
		if(!ptr)
			return;
		page *p = reinterpret_cast<page *>(static_cast<char *>(ptr) - alignment);
		assert(p->bits & page_in_use);
		LOG("Freeing page %zx with bits %d",(char *)(p) - memory() , p->bits - page_in_use);
		free_page(p);
	}